

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O1

bool __thiscall
Lib::DArray<Indexing::CodeTree::LitInfo>::ensure(DArray<Indexing::CodeTree::LitInfo> *this,size_t s)

{
  ulong uVar1;
  LitInfo *pLVar2;
  LitInfo *pLVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = this->_capacity;
  if (uVar1 < s) {
    uVar5 = uVar1 * 2;
    if (uVar1 * 2 <= s) {
      uVar5 = s;
    }
    uVar4 = uVar5 * 0x18 + 0xf & 0xfffffffffffffff0;
    if (uVar4 == 0) {
      pLVar3 = (LitInfo *)
               FixedSizeAllocator<8UL>::alloc
                         ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar4 < 0x11) {
      pLVar3 = (LitInfo *)
               FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar4 < 0x19) {
      pLVar3 = (LitInfo *)
               FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar4 < 0x21) {
      pLVar3 = (LitInfo *)
               FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar4 < 0x31) {
      pLVar3 = (LitInfo *)
               FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar4 < 0x41) {
      pLVar3 = (LitInfo *)
               FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      pLVar3 = (LitInfo *)::operator_new(uVar4,0x10);
    }
    pLVar2 = this->_array;
    if (pLVar2 != (LitInfo *)0x0) {
      uVar4 = this->_capacity * 0x18 + 0xf & 0xfffffffffffffff0;
      if (uVar4 == 0) {
        pLVar2->liIndex = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        pLVar2->litIndex = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pLVar2;
      }
      else if (uVar4 < 0x11) {
        pLVar2->liIndex = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
        pLVar2->litIndex = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pLVar2;
      }
      else if (uVar4 < 0x19) {
        pLVar2->liIndex = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
        pLVar2->litIndex = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pLVar2;
      }
      else if (uVar4 < 0x21) {
        pLVar2->liIndex = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        pLVar2->litIndex = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pLVar2;
      }
      else if (uVar4 < 0x31) {
        pLVar2->liIndex = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        pLVar2->litIndex = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pLVar2;
      }
      else if (uVar4 < 0x41) {
        pLVar2->liIndex = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        pLVar2->litIndex = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pLVar2;
      }
      else {
        operator_delete(pLVar2,0x10);
      }
    }
    this->_size = s;
    this->_capacity = uVar5;
    this->_array = pLVar3;
  }
  else {
    this->_size = s;
  }
  return s <= uVar1;
}

Assistant:

inline bool ensure(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return true;
    }

    size_t newCapacity = std::max(s, _capacity*2);

    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");
    C* newArray=array_new<C>(mem, newCapacity);

    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
    _size = s;
    _capacity = newCapacity;
    _array = newArray;
    return false;
  }